

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O0

PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> * __thiscall
data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
enqueue(PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this,
       SPElement *element)

{
  bool bVar1;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar2;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar3;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *local_28;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *node;
  SPElement *element_local;
  PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this_local;
  
  bVar1 = isEmpty(this);
  if (bVar1) {
    LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::insertToHeader
              (&this->_list,element);
  }
  else {
    pLVar2 = LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::begin
                       (&this->_list);
    bVar1 = _less(this,element,&pLVar2->element);
    if (bVar1) {
      LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::insertToHeader
                (&this->_list,element);
    }
    else {
      local_28 = LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::begin
                           (&this->_list);
      while( true ) {
        pLVar2 = ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::next
                           (local_28);
        pLVar3 = LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::end
                           (&this->_list);
        if (pLVar2 == pLVar3) break;
        pLVar2 = ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::next
                           (local_28);
        bVar1 = _less(this,element,&pLVar2->element);
        if (bVar1) {
          LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::insertAfterNode
                    (&this->_list,local_28,element);
          return this;
        }
        local_28 = ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::next
                             (local_28);
      }
      LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::insertToTail
                (&this->_list,element);
    }
  }
  return this;
}

Assistant:

inline
    PriorityQueue<T>& PriorityQueue<T>::enqueue(const T &element) {
        if (isEmpty()) {
            _list.insertToHeader(element);
            return *this;
        }

        if (_less(element, _list.begin()->element)) {
            _list.insertToHeader(element);
            return *this;
        }

        for (auto node = _list.begin(); node->next() != _list.end(); node = node->next()) {
            if (_less(element, node->next()->element)) {
                _list.insertAfterNode(node, element);
                return *this;
            }
        }
        _list.insertToTail(element);
        return *this;
    }